

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bdelete(bstring b,int pos,int len)

{
  int local_20;
  int local_1c;
  int len_local;
  int pos_local;
  bstring b_local;
  
  local_20 = len;
  local_1c = pos;
  if (pos < 0) {
    local_20 = pos + len;
    local_1c = 0;
  }
  if (((((local_20 < 0) || (b == (bstring)0x0)) || (b->data == (uchar *)0x0)) ||
      ((b->slen < 0 || (b->mlen < b->slen)))) || (b->mlen < 1)) {
    b_local._4_4_ = -1;
  }
  else {
    if ((0 < local_20) && (local_1c < b->slen)) {
      if (local_1c + local_20 < b->slen) {
        if (0 < b->slen - (local_1c + local_20)) {
          memmove(b->data + local_1c,b->data + (long)local_20 + (long)local_1c,
                  (long)(b->slen - (local_1c + local_20)));
        }
        b->slen = b->slen - local_20;
      }
      else {
        b->slen = local_1c;
      }
      b->data[b->slen] = '\0';
    }
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int bdelete (bstring b, int pos, int len) {
	/* Clamp to left side of bstring */
	if (pos < 0) {
		len += pos;
		pos = 0;
	}

	if (len < 0 || b == NULL || b->data == NULL || b->slen < 0 ||
	    b->mlen < b->slen || b->mlen <= 0)
		return BSTR_ERR;
	if (len > 0 && pos < b->slen) {
		if (pos + len >= b->slen) {
			b->slen = pos;
		} else {
			bBlockCopy ((char *) (b->data + pos),
			            (char *) (b->data + pos + len),
			            b->slen - (pos+len));
			b->slen -= len;
		}
		b->data[b->slen] = (unsigned char) '\0';
	}
	return BSTR_OK;
}